

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O1

SolveResult __thiscall Board::backtrack(Board *this,tile_index index,SolveResult *result)

{
  pointer pTVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  TileValue TVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  TileValue TVar14;
  ulong uVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  SolveResult local_50;
  SolveResult local_48;
  
  uVar6 = (ulong)index;
  local_48 = (SolveResult)
             (this->_tiles).super__Vector_base<Tile,_std::allocator<Tile>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_50.backtracks = 1;
  local_50.solved = false;
  local_50._5_3_ = 0;
  if ((long)(this->_tiles).super__Vector_base<Tile,_std::allocator<Tile>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)local_48 >> 3 != uVar6) {
    if (*(int *)((long)local_48 + 4 + uVar6 * 8) == 1) {
      local_48 = backtrack(this,index + 1,result);
      if (((ulong)local_48 >> 0x20 & 1) != 0) {
        local_50 = (SolveResult)((ulong)local_48 >> 0x20);
        uVar6 = 0;
        goto LAB_00105323;
      }
    }
    else {
      TVar14 = this->SIZE;
      bVar17 = TVar14 != Empty;
      local_50 = local_48;
      if (bVar17) {
        local_50._4_4_ = 0;
        local_50.backtracks = index + 1;
        TVar10 = Empty;
        local_48 = local_50;
        do {
          TVar10 = TVar10 + One;
          pTVar1 = (this->_tiles).super__Vector_base<Tile,_std::allocator<Tile>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pTVar1[uVar6].value = TVar10;
          pTVar1[uVar6].status = Processing;
          uVar2 = (ulong)index / (ulong)TVar14;
          uVar3 = (ulong)index % (ulong)TVar14;
          iVar8 = 0;
          uVar15 = (ulong)TVar14;
          bVar16 = false;
          uVar5 = 1;
          do {
            if ((uVar5 - uVar3 != 1) && (pTVar1[(index - (int)uVar3) + iVar8].value == TVar10))
            break;
            iVar8 = iVar8 + 1;
            bVar16 = uVar15 <= uVar5;
            bVar18 = uVar5 != uVar15;
            uVar5 = uVar5 + 1;
          } while (bVar18);
          if (bVar16) {
            iVar8 = 0;
            bVar16 = false;
            uVar5 = 1;
            do {
              if ((uVar5 - uVar2 != 1) && (pTVar1[iVar8 * TVar14 + (int)uVar3].value == TVar10))
              break;
              iVar8 = iVar8 + 1;
              bVar16 = uVar15 <= uVar5;
              bVar18 = uVar5 != uVar15;
              uVar5 = uVar5 + 1;
            } while (bVar18);
            if (bVar16) {
              uVar7 = this->SQUARE_SIZE;
              uVar12 = ((int)(uVar3 / uVar7) + (int)uVar2) - (int)(uVar2 % (ulong)uVar7);
              uVar4 = uVar12 / uVar7;
              uVar12 = uVar12 % uVar7;
              uVar11 = uVar4 * uVar7;
              uVar4 = (uVar4 + 1) * uVar7 - 1;
              bVar16 = uVar4 < uVar11;
              if (uVar11 <= uVar4) {
                uVar13 = uVar12 * uVar7;
                uVar7 = (uVar12 + 1) * uVar7 - 1;
                bVar16 = false;
                do {
                  if (uVar13 <= uVar7) {
                    uVar12 = uVar13;
                    do {
                      uVar9 = uVar12 + uVar11 * TVar14;
                      if ((uVar9 != index) && (pTVar1[uVar9].value == TVar10)) goto LAB_00105248;
                      uVar12 = uVar12 + 1;
                    } while (uVar12 <= uVar7);
                  }
                  uVar11 = uVar11 + 1;
                  bVar16 = uVar4 < uVar11;
                } while (uVar11 <= uVar4);
              }
LAB_00105248:
              if (bVar16) {
                local_48 = backtrack(this,index + 1,result);
                local_50 = (SolveResult)((ulong)local_48 >> 0x20);
                if (((ulong)local_48 >> 0x20 & 1) != 0) break;
              }
            }
          }
          TVar14 = this->SIZE;
          bVar17 = TVar10 < TVar14;
        } while (bVar17);
      }
      if (bVar17) {
        uVar6 = 0;
        goto LAB_00105323;
      }
      pTVar1 = (this->_tiles).super__Vector_base<Tile,_std::allocator<Tile>_>._M_impl.
               super__Vector_impl_data._M_start + uVar6;
      pTVar1->value = Empty;
      pTVar1->status = Empty;
    }
    result->backtracks = result->backtracks + 1;
    local_50.backtracks = 0;
    local_50.solved = false;
    local_50._5_3_ = 0;
  }
  result->solved = local_50.backtracks._0_1_;
  local_48._4_4_ = 0;
  local_48.backtracks = result->backtracks;
  uVar6 = (ulong)(byte)result->field_0x7 << 0x38 | (ulong)*(ushort *)&result->field_0x5 << 0x28;
LAB_00105323:
  return (SolveResult)((ulong)local_48 & 0xffffffff | ((ulong)local_50 & 0xff) << 0x20 | uVar6);
}

Assistant:

SolveResult Board::backtrack(tile_index index, SolveResult &result)
{
	if (index == _tiles.size())
	{
		result.solved = true;
		return result;
	}

	if (_tiles[index].status != TileStatus::Solved)
	{
		for (unsigned int i = 0; i < Board::SIZE; ++i)
		{
			_tiles[index].value = (TileValue)(i + 1);
			_tiles[index].status = TileStatus::Processing;

			if (isTileInsertionValid(index))
			{
				auto r = backtrack(index + 1, result);
				if (r.solved)
					return r;
			}
		}

		_tiles[index].value = TileValue::Empty;
		_tiles[index].status = TileStatus::Empty;
	}
	else
	{
		auto r = backtrack(index + 1, result);
		if (r.solved)
			return r;
	}

	++result.backtracks;
	result.solved = false;
	return result;
}